

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.cpp
# Opt level: O2

unsigned_short
gr::MultiByteToWideChar
          (unsigned_long code_page,unsigned_long param_2,char *source,size_t src_count,
          unsigned_short *dest,size_t dst_count)

{
  ostream *poVar1;
  iconv_t __cd;
  int *piVar2;
  char *pcVar3;
  unsigned_short uVar4;
  size_t dst_count_local;
  size_t src_count_local;
  char *dst_ptr;
  char *src_ptr;
  __string_type fromcode;
  ostringstream oss;
  
  if (dest == (unsigned_short *)0x0) {
    uVar4 = 0;
  }
  else {
    dst_count_local = dst_count;
    src_count_local = src_count;
    if (src_count == 0xffffffffffffffff) {
      src_count_local = strlen(source);
    }
    if (dst_count == 0) {
      uVar4 = (short)src_count_local * 3;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar1 = std::operator<<((ostream *)&oss,"CP");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__cxx11::stringbuf::str();
      __cd = iconv_open("UCS-2LE",fromcode._M_dataplus._M_p);
      if (__cd == (iconv_t)0xffffffffffffffff) {
        poVar1 = std::operator<<((ostream *)&std::cerr,program_invocation_short_name);
        poVar1 = std::operator<<(poVar1,": iconv_open(\"");
        poVar1 = std::operator<<(poVar1,"UCS-2LE");
        poVar1 = std::operator<<(poVar1,"\", \"");
        std::__cxx11::stringbuf::str();
        poVar1 = std::operator<<(poVar1,(string *)&dst_ptr);
        poVar1 = std::operator<<(poVar1,"\"): ");
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        poVar1 = std::operator<<(poVar1,pcVar3);
        std::endl<char,std::char_traits<char>>(poVar1);
        std::__cxx11::string::~string((string *)&dst_ptr);
        exit(1);
      }
      dst_count_local = dst_count * 2;
      dst_ptr = (char *)dest;
      src_ptr = source;
      iconv(__cd,&src_ptr,&src_count_local,&dst_ptr,&dst_count_local);
      iconv_close(__cd);
      uVar4 = (short)(dst_count * 2) - (short)dst_count_local;
      std::__cxx11::string::~string((string *)&fromcode);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    }
  }
  return uVar4;
}

Assistant:

unsigned short MultiByteToWideChar(unsigned long code_page, unsigned long, 
        const char * source, size_t src_count, 
        unsigned short * dest, size_t dst_count)
{
    if (!dest)	// An error condition is indicated by 0
        return 0;

    if (src_count == size_t(-1))     // When passed -1 it should find the 
	src_count = strlen(source);  // length of the source it's self

    if (dst_count == 0)		// We cannot find the completed size so esitmate it.
	return src_count*3;

    std::ostringstream oss; oss << "CP" << code_page;
    auto const fromcode = oss.str();

#if WORDS_BIGENDIAN
    auto const tocode = "UCS-2BE";
#else
    auto const tocode = "UCS-2LE";
#endif
    iconv_t cdesc = iconv_open(tocode, fromcode.c_str());
   
    if (cdesc == iconv_t(-1))
    {
	std::cerr << program_invocation_short_name
                  << ": iconv_open(\"" << tocode << "\", \"" << oss.str() << "\"): "
                  << strerror(errno) << std::endl;
	exit(1);
    }

    char *dst_ptr = reinterpret_cast<char *>(dest);
    char *src_ptr = const_cast<char *>(source);
    dst_count *= sizeof(unsigned short);    
    const size_t dst_size = dst_count;

    iconv(cdesc, &src_ptr, &src_count, &dst_ptr, &dst_count);
    iconv_close(cdesc);
    
    return dst_size - dst_count;
}